

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLUnknown::ParseDeep(XMLUnknown *this,char *p,StrPair *param_3)

{
  char *pcVar1;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char *start;
  
  pcVar1 = StrPair::ParseText((StrPair *)start,unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (pcVar1 == (char *)0x0) {
    XMLDocument::SetError
              (*(XMLDocument **)(in_RDI + 8),XML_ERROR_PARSING_UNKNOWN,in_RSI,(char *)0x0);
  }
  return pcVar1;
}

Assistant:

char* XMLUnknown::ParseDeep( char* p, StrPair* )
{
    // Unknown parses as text.
    const char* start = p;

    p = _value.ParseText( p, ">", StrPair::NEEDS_NEWLINE_NORMALIZATION );
    if ( !p ) {
        _document->SetError( XML_ERROR_PARSING_UNKNOWN, start, 0 );
    }
    return p;
}